

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O3

int ptls_base64_decode(char *text,ptls_base64_decode_state_t *state,ptls_buffer_t *buf)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  sbyte sVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  byte *pbVar11;
  char *pcVar12;
  int iVar14;
  undefined1 auVar13 [16];
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  undefined1 in_XMM14 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM15 [16];
  uint8_t decoded [3];
  undefined1 local_3b [3];
  undefined1 local_38 [16];
  long lVar17;
  
  for (lVar3 = 0; uVar10 = (ulong)(byte)text[lVar3], uVar10 < 0x21; lVar3 = lVar3 + 1) {
    if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
      if (uVar10 == 0) {
        return 0;
      }
      break;
    }
  }
  do {
    if (state->status != 1) {
      return 0;
    }
    bVar5 = (byte)uVar10;
    if (0x7e < bVar5) goto LAB_00111d79;
    lVar4 = lVar3 + 1;
    cVar1 = ptls_base64_values[(char)bVar5];
    if ((int)cVar1 == 0xffffffff) {
      if (bVar5 == 0x3d && state->nbc == 2) {
        if (text[lVar4] == '=') {
          state->nbc = 4;
          lVar4 = lVar3 + 2;
          sVar6 = 0xc;
          uVar7 = 1;
LAB_00111b0e:
          state->nbo = uVar7;
          uVar9 = state->v << sVar6;
          state->v = uVar9;
          goto LAB_00111b19;
        }
      }
      else if ((bVar5 == 0x3d) && (state->nbc == 3)) {
        state->nbc = 4;
        sVar6 = 6;
        uVar7 = 2;
        goto LAB_00111b0e;
      }
LAB_00111d79:
      for (pbVar11 = (byte *)(text + lVar3); (bVar5 = *pbVar11, bVar5 - 9 < 5 || (bVar5 == 0x20));
          pbVar11 = pbVar11 + 1) {
      }
      if (bVar5 == 0) {
        return 0;
      }
      state->nbo = 0;
      iVar8 = 0x232;
      iVar2 = -1;
LAB_00111dbe:
      state->status = iVar2;
      return iVar8;
    }
    iVar2 = state->nbc + 1;
    state->nbc = iVar2;
    uVar9 = state->v << 6 | (int)cVar1;
    state->v = uVar9;
    lVar3 = lVar4;
    if (iVar2 == 4) {
      uVar7 = state->nbo;
      if (0 < (int)uVar7) {
LAB_00111b19:
        lVar3 = (ulong)uVar7 - 1;
        local_38._8_4_ = (int)lVar3;
        local_38._0_8_ = lVar3;
        local_38._12_4_ = (int)((ulong)lVar3 >> 0x20);
        bVar5 = 0x98;
        uVar10 = 0;
        auVar13 = local_38;
        auVar16 = _DAT_00129ed0;
        auVar18 = _DAT_00129f30;
        auVar19 = _DAT_00129f40;
        do {
          auVar21 = local_38 ^ _DAT_00129f50;
          auVar23 = auVar19 ^ _DAT_00129f50;
          iVar2 = auVar21._0_4_;
          iVar29 = -(uint)(iVar2 < auVar23._0_4_);
          iVar8 = auVar21._4_4_;
          auVar24._4_4_ = -(uint)(iVar8 < auVar23._4_4_);
          iVar14 = auVar21._8_4_;
          iVar30 = -(uint)(iVar14 < auVar23._8_4_);
          iVar22 = auVar21._12_4_;
          auVar24._12_4_ = -(uint)(iVar22 < auVar23._12_4_);
          auVar26._4_4_ = iVar29;
          auVar26._0_4_ = iVar29;
          auVar26._8_4_ = iVar30;
          auVar26._12_4_ = iVar30;
          auVar31 = pshuflw(in_XMM14,auVar26,0xe8);
          auVar21._4_4_ = -(uint)(auVar23._4_4_ == iVar8);
          auVar21._12_4_ = -(uint)(auVar23._12_4_ == iVar22);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar23 = pshuflw(in_XMM15,auVar21,0xe8);
          in_XMM15 = auVar23 & auVar31;
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar13 = pshuflw(auVar13,auVar24,0xe8);
          in_XMM14._8_4_ = 0xffffffff;
          in_XMM14._0_8_ = 0xffffffffffffffff;
          in_XMM14._12_4_ = 0xffffffff;
          auVar13 = (auVar13 | in_XMM15) ^ in_XMM14;
          auVar13 = packssdw(auVar13,auVar13);
          if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_3b[uVar10] = (char)(uVar9 >> (bVar5 + 0x78 & 0x1f));
          }
          auVar24 = auVar21 & auVar26 | auVar24;
          auVar13 = packssdw(auVar24,auVar24);
          auVar13 = packssdw(auVar13 ^ in_XMM14,auVar13 ^ in_XMM14);
          auVar13 = packsswb(auVar13,auVar13);
          if ((auVar13._0_4_ >> 8 & 1) != 0) {
            local_3b[uVar10 + 1] = (char)(uVar9 >> (bVar5 + 0x70 & 0x1f));
          }
          auVar13 = auVar18 ^ _DAT_00129f50;
          iVar29 = -(uint)(iVar2 < auVar13._0_4_);
          auVar25._4_4_ = -(uint)(iVar8 < auVar13._4_4_);
          iVar30 = -(uint)(iVar14 < auVar13._8_4_);
          auVar25._12_4_ = -(uint)(iVar22 < auVar13._12_4_);
          auVar27._4_4_ = iVar29;
          auVar27._0_4_ = iVar29;
          auVar27._8_4_ = iVar30;
          auVar27._12_4_ = iVar30;
          auVar23._4_4_ = -(uint)(auVar13._4_4_ == iVar8);
          auVar23._12_4_ = -(uint)(auVar13._12_4_ == iVar22);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar25._0_4_ = auVar25._4_4_;
          auVar25._8_4_ = auVar25._12_4_;
          auVar13 = packssdw(auVar23 & auVar27,auVar25 | auVar23 & auVar27);
          auVar31._8_4_ = 0xffffffff;
          auVar31._0_8_ = 0xffffffffffffffff;
          auVar31._12_4_ = 0xffffffff;
          auVar13 = packssdw(auVar13 ^ auVar31,auVar13 ^ auVar31);
          auVar13 = packsswb(auVar13,auVar13);
          if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
            local_3b[uVar10 + 2] = (char)uVar9;
          }
          auVar21 = _DAT_00129f50 ^ auVar16;
          iVar2 = -(uint)(iVar2 < auVar21._0_4_);
          auVar13._4_4_ = -(uint)(iVar8 < auVar21._4_4_);
          iVar14 = -(uint)(iVar14 < auVar21._8_4_);
          auVar13._12_4_ = -(uint)(iVar22 < auVar21._12_4_);
          auVar28._4_4_ = iVar2;
          auVar28._0_4_ = iVar2;
          auVar28._8_4_ = iVar14;
          auVar28._12_4_ = iVar14;
          auVar23 = pshufhw(auVar28,auVar28,0x84);
          auVar20._4_4_ = -(uint)(auVar21._4_4_ == iVar8);
          auVar20._12_4_ = -(uint)(auVar21._12_4_ == iVar22);
          auVar20._0_4_ = auVar20._4_4_;
          auVar20._8_4_ = auVar20._12_4_;
          auVar21 = pshufhw(auVar20,auVar20,0x84);
          auVar13._0_4_ = auVar13._4_4_;
          auVar13._8_4_ = auVar13._12_4_;
          auVar13 = pshufhw(auVar13,auVar13,0x84);
          auVar31 = (auVar13 | auVar21 & auVar23) ^ auVar31;
          auVar13 = packssdw(auVar31,auVar31);
          auVar13 = packsswb(auVar13,auVar13);
          if ((auVar13._14_2_ >> 8 & 1) != 0) {
            local_38[uVar10 + 0xc] = (char)(uVar9 >> (bVar5 & 0x1f));
          }
          uVar10 = uVar10 + 0x10;
          lVar3 = (long)DAT_00129f60;
          lVar17 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + lVar3;
          lVar15 = DAT_00129f60._8_8_;
          auVar19._8_8_ = lVar17 + lVar15;
          lVar17 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + lVar3;
          auVar18._8_8_ = lVar17 + lVar15;
          lVar17 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + lVar3;
          auVar16._8_8_ = lVar17 + lVar15;
          bVar5 = bVar5 + 0x80;
          auVar13 = _DAT_00129f60;
        } while ((uVar7 + 0xf & 0xfffffff0) != uVar10);
      }
      iVar2 = ptls_buffer__do_pushv(buf,local_3b,(long)(int)uVar7);
      if (iVar2 != 0) {
        return iVar2;
      }
      if (state->nbo < 3) {
        pcVar12 = text + lVar4;
        do {
          cVar1 = *pcVar12;
          pcVar12 = pcVar12 + 1;
        } while (cVar1 != '\0');
        iVar2 = 0;
        iVar8 = 0;
        goto LAB_00111dbe;
      }
      state->v = 0;
      state->nbc = 0;
      state->nbo = 3;
      lVar3 = lVar4;
    }
    uVar10 = (ulong)(byte)text[lVar3];
    if (text[lVar3] == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int ptls_base64_decode(const char *text, ptls_base64_decode_state_t *state, ptls_buffer_t *buf)
{
    int ret = 0;
    uint8_t decoded[3];
    size_t text_index = 0;
    int c;
    signed char vc;

    /* skip initial blanks */
    while (text[text_index] != 0) {
        c = text[text_index];

        if (c == ' ' || c == '\t' || c == '\r' || c == '\n') {
            text_index++;
        } else {
            break;
        }
    }

    while (text[text_index] != 0 && ret == 0 && state->status == PTLS_BASE64_DECODE_IN_PROGRESS) {
        c = text[text_index++];

        vc = 0 < c && c < 0x7f ? ptls_base64_values[c] : -1;
        if (vc == -1) {
            if (state->nbc == 2 && c == '=' && text[text_index] == '=') {
                state->nbc = 4;
                text_index++;
                state->nbo = 1;
                state->v <<= 12;
            } else if (state->nbc == 3 && c == '=') {
                state->nbc = 4;
                state->nbo = 2;
                state->v <<= 6;
            } else {
                /* Skip final blanks */
                for (--text_index; text[text_index] != 0; ++text_index) {
                    c = text[text_index];
                    if (!(c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C))
                        break;
                }

                /* Should now be at end of buffer */
                if (text[text_index] == 0) {
                    break;
                } else {
                    /* Not at end of buffer, signal a decoding error */
                    state->nbo = 0;
                    state->status = PTLS_BASE64_DECODE_FAILED;
                    ret = PTLS_ERROR_INCORRECT_BASE64;
                }
            }
        } else {
            state->nbc++;
            state->v <<= 6;
            state->v |= vc;
        }

        if (ret == 0 && state->nbc == 4) {
            /* Convert to up to 3 octets */
            for (int j = 0; j < state->nbo; j++) {
                decoded[j] = (uint8_t)(state->v >> (8 * (2 - j)));
            }

            ret = ptls_buffer__do_pushv(buf, decoded, state->nbo);

            if (ret == 0) {
                /* test for fin or continuation */
                if (state->nbo < 3) {
                    /* Check that there are only trainling blanks on this line */
                    while (text[text_index] != 0) {
                        c = text[text_index++];

                        if (c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C) {
                            continue;
                        }
                    }
                    if (text[text_index] == 0) {
                        state->status = PTLS_BASE64_DECODE_DONE;
                    } else {
                        state->status = PTLS_BASE64_DECODE_FAILED;
                        ret = PTLS_ERROR_INCORRECT_BASE64;
                    }
                    break;
                } else {
                    state->v = 0;
                    state->nbo = 3;
                    state->nbc = 0;
                }
            }
        }
    }
    return ret;
}